

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbAbc.c
# Opt level: O0

Acb_Ntk_t * Acb_NtkFromAbc2(Abc_Ntk_t *p)

{
  Abc_Nam_t *p_00;
  int iVar1;
  int iVar2;
  int nCos;
  int nObjs;
  char *pcVar3;
  Acb_Man_t *p_01;
  Acb_Ntk_t *p_02;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  word x;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Acb_Ntk_t *pNtk;
  int local_20;
  int NameId;
  int k;
  int i;
  Acb_Man_t *pMan;
  Abc_Ntk_t *p_local;
  
  pcVar3 = Abc_NtkSpec(p);
  p_01 = Acb_ManAlloc(pcVar3,1,(Abc_Nam_t *)0x0,(Abc_Nam_t *)0x0,(Abc_Nam_t *)0x0,
                      (Hash_IntMan_t *)0x0);
  p_00 = p_01->pStrs;
  pcVar3 = Abc_NtkName(p);
  iVar1 = Abc_NamStrFindOrAdd(p_00,pcVar3,(int *)0x0);
  iVar2 = Abc_NtkCiNum(p);
  nCos = Abc_NtkCoNum(p);
  nObjs = Abc_NtkObjNum(p);
  p_02 = Acb_NtkAlloc(p_01,iVar1,iVar2,nCos,nObjs);
  iVar1 = Abc_NtkIsSopLogic(p);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsSopLogic(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbAbc.c"
                  ,0x35,"Acb_Ntk_t *Acb_NtkFromAbc2(Abc_Ntk_t *)");
  }
  p_02->nFaninMax = 6;
  for (NameId = 0; iVar1 = Abc_NtkCiNum(p), NameId < iVar1; NameId = NameId + 1) {
    pAVar4 = Abc_NtkCi(p,NameId);
    iVar1 = Acb_ObjAlloc(p_02,ABC_OPER_CI,0,0);
    (pAVar4->field_6).iTemp = iVar1;
  }
  for (NameId = 0; iVar1 = Vec_PtrSize(p->vObjs), NameId < iVar1; NameId = NameId + 1) {
    pAVar4 = Abc_NtkObj(p,NameId);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar4), iVar1 != 0)) {
      iVar1 = Abc_ObjFaninNum(pAVar4);
      iVar1 = Acb_ObjAlloc(p_02,ABC_OPER_LUT,iVar1,0);
      (pAVar4->field_6).iTemp = iVar1;
    }
  }
  for (NameId = 0; iVar1 = Abc_NtkCoNum(p), NameId < iVar1; NameId = NameId + 1) {
    pAVar4 = Abc_NtkCo(p,NameId);
    iVar1 = Acb_ObjAlloc(p_02,ABC_OPER_CO,1,0);
    (pAVar4->field_6).iTemp = iVar1;
  }
  for (NameId = 0; iVar1 = Vec_PtrSize(p->vObjs), NameId < iVar1; NameId = NameId + 1) {
    pAVar4 = Abc_NtkObj(p,NameId);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar4), iVar1 != 0)) {
      for (local_20 = 0; iVar1 = Abc_ObjFaninNum(pAVar4), local_20 < iVar1; local_20 = local_20 + 1)
      {
        pAVar5 = Abc_ObjFanin(pAVar4,local_20);
        Acb_ObjAddFanin(p_02,(pAVar4->field_6).iTemp,(pAVar5->field_6).iTemp);
      }
    }
  }
  for (NameId = 0; iVar1 = Abc_NtkCoNum(p), NameId < iVar1; NameId = NameId + 1) {
    pAVar4 = Abc_NtkCo(p,NameId);
    iVar1 = (pAVar4->field_6).iTemp;
    pAVar4 = Abc_ObjFanin(pAVar4,0);
    Acb_ObjAddFanin(p_02,iVar1,(pAVar4->field_6).iTemp);
  }
  Acb_NtkCleanObjTruths(p_02);
  for (NameId = 0; iVar1 = Vec_PtrSize(p->vObjs), NameId < iVar1; NameId = NameId + 1) {
    pAVar4 = Abc_NtkObj(p,NameId);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar4), iVar1 != 0)) {
      iVar1 = (pAVar4->field_6).iTemp;
      pcVar3 = (char *)(pAVar4->field_5).pData;
      iVar2 = Abc_ObjFaninNum(pAVar4);
      x = Abc_SopToTruth(pcVar3,iVar2);
      Acb_ObjSetTruth(p_02,iVar1,x);
    }
  }
  iVar1 = Abc_NtkLatchNum(p);
  Acb_NtkSetRegNum(p_02,iVar1);
  Acb_NtkAdd(p_01,p_02);
  return p_02;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Acb_Ntk_t * Acb_NtkFromAbc2( Abc_Ntk_t * p )
{
    Acb_Man_t * pMan = Acb_ManAlloc( Abc_NtkSpec(p), 1, NULL, NULL, NULL, NULL );
    int i, k, NameId = Abc_NamStrFindOrAdd( pMan->pStrs, Abc_NtkName(p), NULL );
    Acb_Ntk_t * pNtk = Acb_NtkAlloc( pMan, NameId, Abc_NtkCiNum(p), Abc_NtkCoNum(p), Abc_NtkObjNum(p) );
    Abc_Obj_t * pObj, * pFanin;
    assert( Abc_NtkIsSopLogic(p) );
    pNtk->nFaninMax = 6;
    Abc_NtkForEachCi( p, pObj, i )
        pObj->iTemp = Acb_ObjAlloc( pNtk, ABC_OPER_CI, 0, 0 );
    Abc_NtkForEachNode( p, pObj, i )
        pObj->iTemp = Acb_ObjAlloc( pNtk, ABC_OPER_LUT, Abc_ObjFaninNum(pObj), 0 );
    Abc_NtkForEachCo( p, pObj, i )
        pObj->iTemp = Acb_ObjAlloc( pNtk, ABC_OPER_CO, 1, 0 );
    Abc_NtkForEachNode( p, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Acb_ObjAddFanin( pNtk, pObj->iTemp, pFanin->iTemp );
    Abc_NtkForEachCo( p, pObj, i )
        Acb_ObjAddFanin( pNtk, pObj->iTemp, Abc_ObjFanin(pObj, 0)->iTemp );
    Acb_NtkCleanObjTruths( pNtk );
    Abc_NtkForEachNode( p, pObj, i )
        Acb_ObjSetTruth( pNtk, pObj->iTemp, Abc_SopToTruth((char *)pObj->pData, Abc_ObjFaninNum(pObj)) );
    Acb_NtkSetRegNum( pNtk, Abc_NtkLatchNum(p) );
    Acb_NtkAdd( pMan, pNtk );
    return pNtk;
}